

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c++
# Opt level: O2

void capnp::compiler::anon_unknown_0::attachDocComment(Builder statement,Array<kj::String> *comment)

{
  size_t sVar1;
  String *line;
  String *pSVar2;
  long lVar3;
  long lVar4;
  char *__n;
  char *pcVar5;
  char *__dest;
  char *__src;
  Array<kj::String> *__range2;
  String *line_1;
  char *local_70;
  Fault f;
  DebugComparison<char_*&,_char_*> _kjCondition;
  Builder builder;
  
  pSVar2 = comment->ptr;
  lVar4 = 0;
  for (lVar3 = comment->size_ * 0x18; lVar3 != 0; lVar3 = lVar3 + -0x18) {
    sVar1 = (pSVar2->content).size_;
    lVar4 = lVar4 + sVar1 + (ulong)(sVar1 == 0);
    pSVar2 = pSVar2 + 1;
  }
  Statement::Builder::initDocComment(&builder,&statement,(uint)lVar4);
  pSVar2 = comment->ptr;
  __dest = builder.content.ptr;
  for (lVar3 = comment->size_ * 0x18; local_70 = __dest, lVar3 != 0; lVar3 = lVar3 + -0x18) {
    pcVar5 = (char *)(pSVar2->content).size_;
    __src = pcVar5;
    if (pcVar5 != (char *)0x0) {
      __src = (pSVar2->content).ptr;
    }
    __n = pcVar5 + -1;
    if (pcVar5 == (char *)0x0) {
      __n = (char *)0x0;
    }
    memcpy(__dest,__src,(size_t)__n);
    sVar1 = (pSVar2->content).size_;
    pcVar5 = (char *)(sVar1 - 1);
    if (sVar1 == 0) {
      pcVar5 = (char *)0x0;
    }
    pcVar5 = __dest + (long)pcVar5;
    __dest = pcVar5 + 1;
    *pcVar5 = '\n';
    pSVar2 = pSVar2 + 1;
  }
  _kjCondition.right = builder.content.ptr + (builder.content.size_ - 1);
  _kjCondition.left = &local_70;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = __dest == _kjCondition.right;
  if (_kjCondition.result) {
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<char*&,char*>&>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/lexer.c++"
             ,0x6d,FAILED,"pos == builder.end()","_kjCondition,",&_kjCondition);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void attachDocComment(Statement::Builder statement, kj::Array<kj::String>&& comment) {
  size_t size = 0;
  for (auto& line: comment) {
    size += line.size() + 1;  // include newline
  }
  Text::Builder builder = statement.initDocComment(size);
  char* pos = builder.begin();
  for (auto& line: comment) {
    memcpy(pos, line.begin(), line.size());
    pos += line.size();
    *pos++ = '\n';
  }
  KJ_ASSERT(pos == builder.end());
}